

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> * __thiscall
docopt::Argument::single_match
          (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *__return_storage_ptr__,
          Argument *this,PatternList *left)

{
  int iVar1;
  __shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  undefined4 extraout_var;
  LeafPattern *local_88;
  undefined1 local_50 [24];
  Argument *arg;
  size_t size;
  size_t i;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *local_20;
  PatternList *left_local;
  Argument *this_local;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *ret;
  
  i._7_1_ = 0;
  local_20 = left;
  left_local = (PatternList *)this;
  this_local = (Argument *)__return_storage_ptr__;
  std::pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_>::
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>,_true>(__return_storage_ptr__);
  size = 0;
  arg = (Argument *)
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::size(local_20);
  while( true ) {
    if (arg <= size) {
      return __return_storage_ptr__;
    }
    this_00 = &std::
               vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ::operator[](local_20,size)->
               super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>;
    peVar2 = std::__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    if (peVar2 == (element_type *)0x0) {
      local_88 = (LeafPattern *)0x0;
    }
    else {
      local_88 = (LeafPattern *)__dynamic_cast(peVar2,&Pattern::typeinfo,&typeinfo,0);
    }
    local_50._16_8_ = local_88;
    if (local_88 != (LeafPattern *)0x0) break;
    size = size + 1;
  }
  __return_storage_ptr__->first = size;
  iVar1 = (*(this->super_LeafPattern).super_Pattern._vptr_Pattern[3])();
  docopt::LeafPattern::getValue((LeafPattern *)local_50._16_8_);
  std::make_shared<docopt::Argument,std::__cxx11::string_const&,docopt::value_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (value *)CONCAT44(extraout_var,iVar1));
  std::shared_ptr<docopt::LeafPattern>::operator=
            (&__return_storage_ptr__->second,(shared_ptr<docopt::Argument> *)local_50);
  std::shared_ptr<docopt::Argument>::~shared_ptr((shared_ptr<docopt::Argument> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<size_t, std::shared_ptr<LeafPattern>> Argument::single_match(PatternList const& left) const
	{
		std::pair<size_t, std::shared_ptr<LeafPattern>> ret {};

		for(size_t i = 0, size = left.size(); i < size; ++i)
		{
			auto arg = dynamic_cast<Argument const*>(left[i].get());
			if (arg) {
				ret.first = i;
				ret.second = std::make_shared<Argument>(name(), arg->getValue());
				break;
			}
		}

		return ret;
	}